

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O1

void __thiscall DynamicKReach::DynamicKReach(DynamicKReach *this,Graph *graph,distance_t k)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  degree_t dVar7;
  vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  quedist_temp_;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  quedeg_temp_;
  greater<std::pair<unsigned_char,_unsigned_int>_> local_89;
  priority_queue<std::pair<unsigned_char,_unsigned_int>,_std::vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>,_std::greater<std::pair<unsigned_char,_unsigned_int>_>_>
  local_88;
  vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  local_68;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_48;
  
  (this->super_AbstractKReach)._vptr_AbstractKReach = (_func_int **)&PTR_construct_00112cb8;
  this->graph_ = graph;
  this->k_ = k;
  (this->index_)._M_h._M_buckets = &(this->index_)._M_h._M_single_bucket;
  (this->index_)._M_h._M_bucket_count = 1;
  (this->index_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->index_)._M_h._M_element_count = 0;
  (this->index_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->quedist_).c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quedist_).c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quedist_).c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->index_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar7 = Graph::num_vertices(graph);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->degree_,(ulong)dVar7,(allocator_type *)&local_88);
  dVar7 = Graph::num_vertices(graph);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->queue_,(ulong)dVar7,(allocator_type *)&local_88);
  (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index_temp_)._M_h._M_buckets = &(this->index_temp_)._M_h._M_single_bucket;
  (this->index_temp_)._M_h._M_bucket_count = 1;
  (this->index_temp_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->index_temp_)._M_h._M_element_count = 0;
  (this->index_temp_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->index_temp_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->index_temp_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_48.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dVar7 = Graph::num_vertices(graph);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::reserve(&local_48,(ulong)dVar7);
  std::
  priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
  ::priority_queue((priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)&local_88,(less<std::pair<unsigned_int,_unsigned_int>_> *)&local_68,&local_48)
  ;
  ppVar1 = (this->quedeg_).c.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->quedeg_).c.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = (this->quedeg_).c.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_88.c.
                super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_88.c.
                super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_88.c.
                super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar1;
  local_88.c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppVar2;
  local_88.c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar3;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)ppVar3 - (long)ppVar1);
  }
  dVar7 = Graph::num_vertices(graph);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this->updated_,(ulong)dVar7);
  local_68.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar7 = Graph::num_vertices(graph);
  std::
  vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ::reserve(&local_68,(ulong)dVar7);
  std::
  priority_queue<std::pair<unsigned_char,_unsigned_int>,_std::vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>,_std::greater<std::pair<unsigned_char,_unsigned_int>_>_>
  ::priority_queue(&local_88,&local_89,&local_68);
  ppVar4 = (this->quedist_).c.
           super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->quedist_).c.
           super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar6 = (this->quedist_).c.
           super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->quedist_).c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_88.c.
       super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->quedist_).c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_88.c.
       super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->quedist_).c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.c.
       super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = ppVar4;
  local_88.c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  local_88.c.
  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar6;
  if (ppVar4 != (pointer)0x0) {
    operator_delete(ppVar4,(long)ppVar6 - (long)ppVar4);
  }
  if (local_68.
      super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DynamicKReach::DynamicKReach(const Graph &graph, distance_t k)
        : graph_(graph), k_(k), degree_(graph.num_vertices()), queue_(graph.num_vertices()){
    vector<pair<degree_t, vertex_t>> quedeg_temp_;
    quedeg_temp_.reserve(graph.num_vertices());
    DegreeQueue(less<pair<degree_t, vertex_t>>(), move(quedeg_temp_)).swap(quedeg_);
    updated_.reserve(graph.num_vertices());
    vector<pair<distance_t, vertex_t>> quedist_temp_;
    quedist_temp_.reserve(graph.num_vertices());
    DistanceQueue(greater<pair<distance_t, vertex_t>>(), move(quedist_temp_)).swap(quedist_);
}